

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void dump_alSourcei(CallerInfo *callerinfo,ALuint name,ALenum param,ALint value)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  ALint value_local;
  ALenum param_local;
  ALuint name_local;
  CallerInfo *callerinfo_local;
  
  if (param == 0x1009) {
    pcVar1 = sourceString(name);
    pcVar2 = alenumString(0x1009);
    pcVar3 = bufferString(value);
    printf("(%s, %s, %s)\n",pcVar1,pcVar2,pcVar3);
  }
  else if (param == 0x1007) {
    pcVar1 = sourceString(name);
    pcVar2 = alenumString(0x1007);
    pcVar3 = alboolString((ALCboolean)value);
    printf("(%s, %s, %s)\n",pcVar1,pcVar2,pcVar3);
  }
  else if (param == 0x202) {
    pcVar1 = sourceString(name);
    pcVar2 = alenumString(0x202);
    pcVar3 = alenumString(value);
    printf("(%s, %s, %s)\n",pcVar1,pcVar2,pcVar3);
  }
  else if (param == 0x1027) {
    pcVar1 = sourceString(name);
    pcVar2 = alenumString(0x1027);
    pcVar3 = alenumString(value);
    printf("(%s, %s, %s)\n",pcVar1,pcVar2,pcVar3);
  }
  else if (param == 0x1010) {
    pcVar1 = sourceString(name);
    pcVar2 = alenumString(0x1010);
    pcVar3 = alenumString(value);
    printf("(%s, %s, %s)\n",pcVar1,pcVar2,pcVar3);
  }
  else {
    pcVar1 = sourceString(name);
    pcVar2 = alenumString(param);
    printf("(%s, %s, %d)\n",pcVar1,pcVar2,(ulong)(uint)value);
  }
  return;
}

Assistant:

static void dump_alSourcei(CallerInfo *callerinfo, ALuint name, ALenum param, ALint value)
{
    if (param == AL_BUFFER) {
        printf("(%s, %s, %s)\n", sourceString(name), alenumString(param), bufferString((ALuint) value));
    } else if (param == AL_LOOPING) {
        printf("(%s, %s, %s)\n", sourceString(name), alenumString(param), alboolString((ALboolean) value));
    } else if (param == AL_SOURCE_RELATIVE) {
        printf("(%s, %s, %s)\n", sourceString(name), alenumString(param), alenumString((ALenum) value));
    } else if (param == AL_SOURCE_TYPE) {
        printf("(%s, %s, %s)\n", sourceString(name), alenumString(param), alenumString((ALenum) value));
    } else if (param == AL_SOURCE_STATE) {
        printf("(%s, %s, %s)\n", sourceString(name), alenumString(param), alenumString((ALenum) value));
    } else {
        printf("(%s, %s, %d)\n", sourceString(name), alenumString(param), (int) value);
    }
}